

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  cmake *this_00;
  bool bVar1;
  bool bVar2;
  pointer pcVar3;
  reference ppcVar4;
  char *str2;
  undefined1 local_b8 [8];
  cmDocumentationEntry e;
  cmGlobalGeneratorFactory *g;
  iterator __end1;
  iterator __begin1;
  RegisteredGeneratorsVector *__range1;
  bool foundDefaultOne;
  string local_40 [8];
  string defaultName;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> defaultGenerator;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v_local;
  cmake *this_local;
  
  this_00 = (cmake *)((long)&defaultName.field_2 + 8);
  EvaluateDefaultGlobalGenerator(this_00);
  pcVar3 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                     ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                      this_00);
  (*pcVar3->_vptr_cmGlobalGenerator[3])(local_40);
  bVar1 = false;
  __end1 = std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::
           begin(&this->Generators);
  g = (cmGlobalGeneratorFactory *)
      std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::end
                (&this->Generators);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
                                     *)&g), bVar2) {
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
              ::operator*(&__end1);
    e._64_8_ = *ppcVar4;
    cmDocumentationEntry::cmDocumentationEntry((cmDocumentationEntry *)local_b8);
    (**(code **)(*(long *)e._64_8_ + 0x18))(e._64_8_,(cmDocumentationEntry *)local_b8);
    if (!bVar1) {
      str2 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::StringStartsWith((string *)local_b8,str2);
      if (bVar2) {
        e.Brief.field_2._M_local_buf[8] = '*';
        bVar1 = true;
      }
    }
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
              (v,(value_type *)local_b8);
    cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_b8);
    __gnu_cxx::
    __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_40);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
             ((long)&defaultName.field_2 + 8));
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const std::string defaultName = defaultGenerator->GetName();
  bool foundDefaultOne = false;

  for (cmGlobalGeneratorFactory* g : this->Generators) {
    cmDocumentationEntry e;
    g->GetDocumentation(e);
    if (!foundDefaultOne &&
        cmSystemTools::StringStartsWith(e.Name, defaultName.c_str())) {
      e.CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
    v.push_back(std::move(e));
  }
}